

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqstdmath.cpp
# Opt level: O2

SQInteger math_max(HSQUIRRELVM v)

{
  HSQOBJECT obj;
  bool bVar1;
  SQInteger SVar2;
  SQRESULT SVar3;
  long idx;
  SQInteger cres;
  SQObject objRes;
  SQObject cur;
  
  SVar2 = sq_gettop(v);
  sq_getstackobj(v,2,&objRes);
  idx = 3;
  while( true ) {
    if (SVar2 < idx) {
      obj._unVal.pTable = objRes._unVal.pTable;
      obj._type = objRes._type;
      obj._flags = objRes._flags;
      obj._5_3_ = objRes._5_3_;
      sq_pushobject(v,obj);
      return 1;
    }
    sq_getstackobj(v,idx,&cur);
    if ((cur._type >> 0x1a & 1) == 0) break;
    cres = 0;
    bVar1 = sq_cmpraw(v,&cur,&objRes,&cres);
    if (!bVar1) {
      SVar3 = sq_throwerror(v,"Internal error, comparison failed");
      return SVar3;
    }
    if (cres == 1) {
      objRes._flags = cur._flags;
      objRes._5_3_ = cur._5_3_;
      objRes._type = cur._type;
      objRes._unVal = cur._unVal;
    }
    idx = idx + 1;
  }
  sq_throwparamtypeerror(v,idx,6,(ulong)cur._type);
  return -1;
}

Assistant:

static SQInteger math_max(HSQUIRRELVM v)
{
  return math_min_max<+1>(v);
}